

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::BlockGroup::Parse(BlockGroup *this)

{
  long lVar1;
  
  lVar1 = Block::Parse(&this->m_block,(this->super_BlockEntry).m_pCluster);
  if (lVar1 == 0) {
    (this->m_block).m_flags =
         (this->m_next < 1 && 0 < this->m_prev) << 7 | (this->m_block).m_flags & 0x7f;
  }
  return lVar1;
}

Assistant:

long BlockGroup::Parse() {
  const long status = m_block.Parse(m_pCluster);

  if (status)
    return status;

  m_block.SetKey((m_prev > 0) && (m_next <= 0));

  return 0;
}